

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O2

int blake2sp_init(blake2sp_state *S,size_t outlen)

{
  int iVar1;
  long lVar2;
  blake2sp_state *S_00;
  
  if (0xffffffffffffffdf < outlen - 0x21) {
    memset(S->buf,0,0x208);
    S->outlen = outlen;
    iVar1 = blake2sp_init_root(S->R,outlen,0);
    if (-1 < iVar1) {
      lVar2 = 0;
      S_00 = S;
      do {
        if (lVar2 == 8) {
          S->R[0].last_node = '\x01';
          S->S[7][0].last_node = '\x01';
          return 0;
        }
        iVar1 = blake2sp_init_leaf((blake2s_state *)S_00,outlen,0,(uint32_t)lVar2);
        lVar2 = lVar2 + 1;
        S_00 = (blake2sp_state *)(S_00->S + 1);
      } while (-1 < iVar1);
    }
  }
  return -1;
}

Assistant:

int blake2sp_init( blake2sp_state *S, size_t outlen )
{
  size_t i;

  if( !outlen || outlen > BLAKE2S_OUTBYTES ) return -1;

  memset( S->buf, 0, sizeof( S->buf ) );
  S->buflen = 0;
  S->outlen = outlen;

  if( blake2sp_init_root( S->R, outlen, 0 ) < 0 )
    return -1;

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
    if( blake2sp_init_leaf( S->S[i], outlen, 0, (uint32_t)i ) < 0 ) return -1;

  S->R->last_node = 1;
  S->S[PARALLELISM_DEGREE - 1]->last_node = 1;
  return 0;
}